

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reference.cpp
# Opt level: O2

void check_object_ref<debugger_type>(object_ref<debugger_type,_false> *ref,debugger_type *value)

{
  SourceLineInfo local_128;
  BinaryExpr<const_debugger_type_&,_const_type_safe::object_ref<debugger_type,_false>_&> local_118;
  AssertionHandler catchAssertionHandler;
  debugger_type *local_a0;
  debugger_type *local_98;
  StringRef local_90;
  StringRef local_80;
  StringRef local_70;
  StringRef local_60;
  StringRef local_50;
  StringRef local_40;
  
  local_118.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x1c48db;
  local_118.super_ITransientExpression.m_isBinaryExpression = true;
  local_118.super_ITransientExpression.m_result = false;
  local_118.super_ITransientExpression._10_6_ = 0;
  local_128.file =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/reference.cpp";
  local_128.line = 0x16;
  Catch::StringRef::StringRef(&local_40,"value.ctor()");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_118,&local_128,local_40,Normal);
  local_118.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)
       CONCAT71(local_118.super_ITransientExpression._vptr_ITransientExpression._1_7_,
                value->from_ctor);
  Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_118);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_118.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x1c48db;
  local_118.super_ITransientExpression.m_isBinaryExpression = true;
  local_118.super_ITransientExpression.m_result = false;
  local_118.super_ITransientExpression._10_6_ = 0;
  local_128.file =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/reference.cpp";
  local_128.line = 0x17;
  Catch::StringRef::StringRef(&local_50,"&ref.get() == &value");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_118,&local_128,local_50,Normal);
  local_98 = ref->ptr_;
  local_128.file = (char *)&local_98;
  local_a0 = value;
  Catch::ExprLhs<debugger_type*const&>::operator==
            ((BinaryExpr<debugger_type_*const_&,_const_debugger_type_*const_&> *)&local_118,
             (ExprLhs<debugger_type*const&> *)&local_128,&local_a0);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_118.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_118.super_ITransientExpression);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_118.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x1c48db;
  local_118.super_ITransientExpression.m_isBinaryExpression = true;
  local_118.super_ITransientExpression.m_result = false;
  local_118.super_ITransientExpression._10_6_ = 0;
  local_128.file =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/reference.cpp";
  local_128.line = 0x18;
  Catch::StringRef::StringRef(&local_60,"&*ref == &value");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_118,&local_128,local_60,Normal);
  local_98 = ref->ptr_;
  local_128.file = (char *)&local_98;
  local_a0 = value;
  Catch::ExprLhs<debugger_type*const&>::operator==
            ((BinaryExpr<debugger_type_*const_&,_const_debugger_type_*const_&> *)&local_118,
             (ExprLhs<debugger_type*const&> *)&local_128,&local_a0);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_118.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_118.super_ITransientExpression);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_118.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x1c48db;
  local_118.super_ITransientExpression.m_isBinaryExpression = true;
  local_118.super_ITransientExpression.m_result = false;
  local_118.super_ITransientExpression._10_6_ = 0;
  local_128.file =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/reference.cpp";
  local_128.line = 0x19;
  Catch::StringRef::StringRef(&local_70,"ref->id == value.id");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_118,&local_128,local_70,Normal);
  local_128.file = (char *)ref->ptr_;
  Catch::ExprLhs<int_const&>::operator==
            ((BinaryExpr<const_int_&,_const_int_&> *)&local_118,(ExprLhs<int_const&> *)&local_128,
             &value->id);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_118.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_118.super_ITransientExpression);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_118.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x1c48db;
  local_118.super_ITransientExpression.m_isBinaryExpression = true;
  local_118.super_ITransientExpression.m_result = false;
  local_118.super_ITransientExpression._10_6_ = 0;
  local_128.file =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/reference.cpp";
  local_128.line = 0x1a;
  Catch::StringRef::StringRef(&local_80,"ref == value");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_118,&local_128,local_80,Normal);
  local_128.file = (char *)ref;
  Catch::ExprLhs<type_safe::object_ref<debugger_type,false>const&>::operator==
            ((BinaryExpr<const_type_safe::object_ref<debugger_type,_false>_&,_const_debugger_type_&>
              *)&local_118,(ExprLhs<type_safe::object_ref<debugger_type,false>const&> *)&local_128,
             value);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_118.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_118.super_ITransientExpression);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_118.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x1c48db;
  local_118.super_ITransientExpression.m_isBinaryExpression = true;
  local_118.super_ITransientExpression.m_result = false;
  local_118.super_ITransientExpression._10_6_ = 0;
  local_128.file =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/reference.cpp";
  local_128.line = 0x1b;
  Catch::StringRef::StringRef(&local_90,"value == ref");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_118,&local_128,local_90,Normal);
  local_128.file = (char *)value;
  Catch::ExprLhs<debugger_type_const&>::operator==
            (&local_118,(ExprLhs<debugger_type_const&> *)&local_128,ref);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_118.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_118.super_ITransientExpression);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  return;
}

Assistant:

void check_object_ref(const object_ref<T>& ref, const debugger_type& value)
{
    REQUIRE(value.ctor());
    REQUIRE(&ref.get() == &value);
    REQUIRE(&*ref == &value);
    REQUIRE(ref->id == value.id);
    REQUIRE(ref == value);
    REQUIRE(value == ref);
}